

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::detail::ResultBuilder::
binary_assert<0,std::vector<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>>,std::vector<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>>>
          (ResultBuilder *this,
          vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
          *lhs,vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
               *rhs)

{
  pointer pKVar1;
  pointer pKVar2;
  ContextOptions *pCVar3;
  pointer pKVar4;
  vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
  *in_R8;
  String SStack_38;
  
  pKVar2 = (lhs->
           super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pKVar1 = (lhs->
           super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pKVar4 = (rhs->
           super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)pKVar1 - (long)pKVar2 ==
      (long)(rhs->
            super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pKVar4) {
    for (; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
      if ((pKVar2->key).super_array<unsigned_char,_1UL>._M_elems[0] !=
          (pKVar4->key).super_array<unsigned_char,_1UL>._M_elems[0]) goto LAB_00151db9;
      pKVar4 = pKVar4 + 1;
    }
    (this->super_AssertData).m_failed = false;
    pCVar3 = getContextOptions();
    if (pCVar3->success != true) {
      return;
    }
  }
  else {
LAB_00151db9:
    (this->super_AssertData).m_failed = true;
  }
  stringifyBinaryExpr<std::vector<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>>,std::vector<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>>>
            (&SStack_38,(detail *)lhs,
             (vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
              *)0x1bc83a,(char *)rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }